

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O3

void TestConstExpr::ConstCastTestT<unsigned_int>(void)

{
  if (ConstCastTestT<unsigned_int>()::b == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::w == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::c == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::sc == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::uc == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::s == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::us == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::i == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::ui == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::l == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::ul == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::ll == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::ull == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::st == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::pt == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  if (ConstCastTestT<unsigned_int>()::pl == '\0') {
    ConstCastTestT<unsigned_int>();
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}